

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O1

any * __thiscall
Omega_h::InputYamlReader::at_shift
          (any *__return_storage_ptr__,InputYamlReader *this,int token,string *text)

{
  pointer pcVar1;
  
  if ((token == 0x13) || (token == 3)) {
    if (text->_M_string_length == 0) {
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0);
    }
    pcVar1 = (text->_M_dataplus)._M_p;
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(char *)&__return_storage_ptr__->storage = *pcVar1;
  }
  else if (token == 0) {
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
    any::do_construct<std::__cxx11::string,std::__cxx11::string>(__return_storage_ptr__,text);
  }
  else {
    __return_storage_ptr__->vtable = (vtable_type *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

any at_shift(int token, std::string& text) override final {
    switch (token) {
      case yaml::TOK_NEWLINE: {
        return any(std::move(text));
      }
      case yaml::TOK_SPACE:
      case yaml::TOK_OTHER: {
        return text.at(0);
      }
    }
    return any();
  }